

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O3

TransformNode * __thiscall
rengine::AllocationPool<rengine::TransformNode>::allocate
          (AllocationPool<rengine::TransformNode> *this)

{
  Node **ppNVar1;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  **ppvVar2;
  undefined1 *puVar3;
  uint uVar4;
  TransformNode *pTVar5;
  uint *puVar6;
  
  uVar4 = this->m_nextFree;
  if (this->m_poolSize <= uVar4) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,
                  "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
                 );
  }
  pTVar5 = this->m_memory;
  if (pTVar5 == (TransformNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,
                  "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
                 );
  }
  puVar6 = this->m_free;
  if (puVar6 == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,
                  "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
                 );
  }
  if (puVar6[uVar4] < this->m_poolSize) {
    this->m_nextFree = uVar4 + 1;
    uVar4 = puVar6[uVar4];
    pTVar5[uVar4].super_Node.m_prev = (Node *)0x0;
    ppNVar1 = &pTVar5[uVar4].super_Node.m_child;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    ppvVar2 = &pTVar5[uVar4].super_Node.super_SignalEmitter.m_buckets;
    *ppvVar2 = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                *)0x0;
    ppvVar2[1] = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                  *)0x0;
    *(uint *)&pTVar5[uVar4].super_Node.field_0x30 =
         (*(uint *)&pTVar5[uVar4].super_Node.field_0x30 & 0xfffff800) + 1;
    pTVar5[uVar4].super_Node.super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Node_001450c0;
    puVar3 = &pTVar5[uVar4].super_Node.field_0x34;
    *(undefined8 *)puVar3 = 0x3f800000;
    *(undefined8 *)(puVar3 + 8) = 0;
    *(undefined8 *)&pTVar5[uVar4].field_0x44 = 0x3f80000000000000;
    *(undefined8 *)(&pTVar5[uVar4].field_0x44 + 8) = 0;
    *(undefined8 *)&pTVar5[uVar4].field_0x54 = 0;
    *(undefined8 *)(&pTVar5[uVar4].field_0x54 + 8) = 0x3f800000;
    *(undefined8 *)&pTVar5[uVar4].field_0x64 = 0;
    *(undefined8 *)(&pTVar5[uVar4].field_0x64 + 8) = 0x3f80000000000000;
    *(undefined8 *)&pTVar5[uVar4].field_0x74 = 0;
    return pTVar5 + uVar4;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,
                "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
               );
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }